

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

void prvTidyTakeConfigSnapshot(TidyDocImpl *doc)

{
  ulong uVar1;
  TidyOptionValue *oldval;
  TidyOptionImpl *option;
  
  oldval = (doc->config).snapshot;
  AdjustConfig(doc);
  option = option_defs;
  uVar1 = 0;
  do {
    if (uVar1 != option->id) {
      __assert_fail("ixVal == (uint) option->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,0x2cf,"void prvTidyTakeConfigSnapshot(TidyDocImpl *)");
    }
    CopyOptionValue(doc,option,oldval,oldval + -0x69);
    option = option + 1;
    uVar1 = uVar1 + 1;
    oldval = oldval + 1;
  } while (uVar1 != 0x68);
  return;
}

Assistant:

void TY_(TakeConfigSnapshot)( TidyDocImpl* doc )
{
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    const TidyOptionValue* value = &doc->config.value[ 0 ];
    TidyOptionValue* snap  = &doc->config.snapshot[ 0 ];

    AdjustConfig( doc );  /* Make sure it's consistent */
    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        assert( ixVal == (uint) option->id );
        CopyOptionValue( doc, option, &snap[ixVal], &value[ixVal] );
    }
}